

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Cos::Cos(Cos *this)

{
  allocator<char> local_61;
  string local_60;
  Interval local_40;
  Interval local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"cos",&local_61);
  local_28.m_hasNaN = false;
  local_28.m_lo = -1.0;
  local_28.m_hi = -1.0;
  local_40.m_hasNaN = false;
  local_40.m_lo = 1.0;
  local_40.m_hi = 1.0;
  TrigFunc::TrigFunc(&this->super_TrigFunc,&local_60,deCos,&local_28,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_TrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00a28d38;
  return;
}

Assistant:

Cos			(void) : TrigFunc("cos", deCos, -1.0, 1.0) {}